

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

void __thiscall
eggs::variants::detail::
_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_false,_true>
::_storage(_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_false,_true>
           *this,_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_false,_true>
                 *rhs)

{
  size_t sVar1;
  void *local_30;
  void *local_28;
  visitor<eggs::variants::detail::copy_construct,void(void*,void_const*)> local_19;
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_false,_true>
  *local_18;
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_false,_true>
  *rhs_local;
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_false,_true>
  *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_true,_true>
  ::_storage(&this->
              super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_true,_true>
            );
  sVar1 = (local_18->
          super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_true,_true>
          )._which;
  local_28 = _union<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_false>
             ::target((_union<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_false>
                       *)this);
  local_30 = _union<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_false>
             ::target((_union<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_false>
                       *)local_18);
  visitor<eggs::variants::detail::copy_construct,void(void*,void_const*)>::operator()
            (&local_19,sVar1,&local_28,&local_30);
  (this->
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_true,_true>
  )._which = (local_18->
             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_int,_std::shared_ptr<Var>_>,_true,_true>
             )._which;
  return;
}

Assistant:

EGGS_CXX11_NOEXCEPT_IF(all_of<pack<
                std::is_nothrow_copy_constructible<Ts>...
            >>::value)
#endif
          : base_type{}
        {
            detail::copy_construct{}(
                pack<Ts...>{}, rhs._which
              , target(), rhs.target()
            );
            _which = rhs._which;
        }